

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void Qentem::TestOutPut::Print<char[14],unsigned_int,char[18],unsigned_int,char[3]>
               (char (*values) [14],uint *values_1,char (*values_2) [18],uint *values_3,
               char (*values_4) [3])

{
  wstringstream **ppwVar1;
  wostream *pwVar2;
  char (*values_local_4) [3];
  uint *values_local_3;
  char (*values_local_2) [18];
  uint *values_local_1;
  char (*values_local) [14];
  
  ppwVar1 = GetStreamCache_abi_cxx11_();
  if (*ppwVar1 == (wstringstream *)0x0) {
    pwVar2 = std::operator<<((wostream *)&std::wcout,*values);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_1);
    pwVar2 = std::operator<<(pwVar2,*values_2);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_3);
    std::operator<<(pwVar2,*values_4);
  }
  else {
    ppwVar1 = GetStreamCache_abi_cxx11_();
    pwVar2 = std::operator<<((wostream *)(*ppwVar1 + 0x10),*values);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_1);
    pwVar2 = std::operator<<(pwVar2,*values_2);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_3);
    std::operator<<(pwVar2,*values_4);
  }
  return;
}

Assistant:

inline static void Print(const Values_T &...values) {
        if (GetStreamCache() == nullptr) {
#if __cplusplus > 201402L
            (std::wcout << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {(std::wcout << values, 0)...};
            (void)dummy;
#endif

        } else {
#if __cplusplus > 201402L
            ((*GetStreamCache()) << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {((*GetStreamCache()) << values, 0)...};
            (void)dummy;
#endif
        }
    }